

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_predict.c
# Opt level: O0

int PredictorSetup(TIFF *tif)

{
  uint uVar1;
  uint *puVar2;
  tmsize_t tVar3;
  uint local_30;
  TIFFDirectory *td;
  TIFFPredictorState *sp;
  TIFF *tif_local;
  
  puVar2 = (uint *)tif->tif_data;
  uVar1 = *puVar2;
  if (uVar1 == 1) {
    return 1;
  }
  if (uVar1 == 2) {
    if (((((tif->tif_dir).td_bitspersample != 8) && ((tif->tif_dir).td_bitspersample != 0x10)) &&
        ((tif->tif_dir).td_bitspersample != 0x20)) && ((tif->tif_dir).td_bitspersample != 0x40)) {
      TIFFErrorExtR(tif,"PredictorSetup",
                    "Horizontal differencing \"Predictor\" not supported with %u-bit samples",
                    (ulong)(tif->tif_dir).td_bitspersample);
      return 0;
    }
  }
  else {
    if (uVar1 != 3) {
      TIFFErrorExtR(tif,"PredictorSetup","\"Predictor\" value %d not supported",(ulong)*puVar2);
      return 0;
    }
    if ((tif->tif_dir).td_sampleformat != 3) {
      TIFFErrorExtR(tif,"PredictorSetup",
                    "Floating point \"Predictor\" not supported with %u data format",
                    (ulong)(tif->tif_dir).td_sampleformat);
      return 0;
    }
    if ((((tif->tif_dir).td_bitspersample != 0x10) && ((tif->tif_dir).td_bitspersample != 0x18)) &&
       (((tif->tif_dir).td_bitspersample != 0x20 && ((tif->tif_dir).td_bitspersample != 0x40)))) {
      TIFFErrorExtR(tif,"PredictorSetup",
                    "Floating point \"Predictor\" not supported with %u-bit samples",
                    (ulong)(tif->tif_dir).td_bitspersample);
      return 0;
    }
  }
  if ((tif->tif_dir).td_planarconfig == 1) {
    local_30 = (uint)(tif->tif_dir).td_samplesperpixel;
  }
  else {
    local_30 = 1;
  }
  *(long *)(puVar2 + 2) = (long)(int)local_30;
  if ((tif->tif_flags & 0x400) == 0) {
    tVar3 = TIFFScanlineSize(tif);
    *(tmsize_t *)(puVar2 + 4) = tVar3;
  }
  else {
    tVar3 = TIFFTileRowSize(tif);
    *(tmsize_t *)(puVar2 + 4) = tVar3;
  }
  tif_local._4_4_ = (uint)(*(long *)(puVar2 + 4) != 0);
  return tif_local._4_4_;
}

Assistant:

static int PredictorSetup(TIFF *tif)
{
    static const char module[] = "PredictorSetup";

    TIFFPredictorState *sp = PredictorState(tif);
    TIFFDirectory *td = &tif->tif_dir;

    switch (sp->predictor) /* no differencing */
    {
        case PREDICTOR_NONE:
            return 1;
        case PREDICTOR_HORIZONTAL:
            if (td->td_bitspersample != 8 && td->td_bitspersample != 16 &&
                td->td_bitspersample != 32 && td->td_bitspersample != 64)
            {
                TIFFErrorExtR(tif, module,
                              "Horizontal differencing \"Predictor\" not "
                              "supported with %" PRIu16 "-bit samples",
                              td->td_bitspersample);
                return 0;
            }
            break;
        case PREDICTOR_FLOATINGPOINT:
            if (td->td_sampleformat != SAMPLEFORMAT_IEEEFP)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Floating point \"Predictor\" not supported with %" PRIu16
                    " data format",
                    td->td_sampleformat);
                return 0;
            }
            if (td->td_bitspersample != 16 && td->td_bitspersample != 24 &&
                td->td_bitspersample != 32 && td->td_bitspersample != 64)
            { /* Should 64 be allowed? */
                TIFFErrorExtR(
                    tif, module,
                    "Floating point \"Predictor\" not supported with %" PRIu16
                    "-bit samples",
                    td->td_bitspersample);
                return 0;
            }
            break;
        default:
            TIFFErrorExtR(tif, module, "\"Predictor\" value %d not supported",
                          sp->predictor);
            return 0;
    }
    sp->stride =
        (td->td_planarconfig == PLANARCONFIG_CONTIG ? td->td_samplesperpixel
                                                    : 1);
    /*
     * Calculate the scanline/tile-width size in bytes.
     */
    if (isTiled(tif))
        sp->rowsize = TIFFTileRowSize(tif);
    else
        sp->rowsize = TIFFScanlineSize(tif);
    if (sp->rowsize == 0)
        return 0;

    return 1;
}